

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O1

void __thiscall
QPDFAcroFormDocumentHelper::adjustInheritedFields
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *obj,bool override_da,
          string *from_default_da,bool override_q,int from_default_q)

{
  bool bVar1;
  int iVar2;
  string *key;
  string *key_00;
  string da;
  QPDFFormFieldObjectHelper cur_field;
  QPDFObjectHandle local_e8;
  string local_d8;
  undefined1 local_b8 [48];
  undefined1 local_88 [32];
  QPDFFormFieldObjectHelper local_68;
  
  if (override_da || override_q) {
    local_b8._32_8_ =
         (obj->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_b8._40_8_ =
         (obj->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_)->_M_use_count + 1;
      }
    }
    QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
              ((QPDFFormFieldObjectHelper *)(local_88 + 0x20),(QPDFObjectHandle *)(local_b8 + 0x20))
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_);
    }
    if (override_da) {
      local_88._0_8_ = local_88 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"/DA","");
      bVar1 = adjustInheritedFields::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(local_88 + 0x20),
                         (QPDFFormFieldObjectHelper *)local_88,key);
      bVar1 = !bVar1;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,(ulong)((long)(_func_int ***)local_88._16_8_ + 1));
      }
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
      QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_
                ((string *)local_b8,(QPDFFormFieldObjectHelper *)(local_88 + 0x20));
      if (((element_type *)local_b8._8_8_ != (element_type *)from_default_da->_M_string_length) ||
         (((element_type *)local_b8._8_8_ != (element_type *)0x0 &&
          (iVar2 = bcmp((void *)local_b8._0_8_,(from_default_da->_M_dataplus)._M_p,local_b8._8_8_),
          iVar2 != 0)))) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/DA","");
        QPDFObjectHandle::newUnicodeString(&local_e8,from_default_da);
        QPDFObjectHandle::replaceKey(obj,&local_d8,&local_e8);
        if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
    }
    if (override_q) {
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"/Q","");
      bVar1 = adjustInheritedFields::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(local_88 + 0x20),
                         (QPDFFormFieldObjectHelper *)local_b8,key_00);
      bVar1 = !bVar1;
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
    }
    else {
      bVar1 = false;
    }
    if ((bVar1) &&
       (iVar2 = QPDFFormFieldObjectHelper::getQuadding
                          ((QPDFFormFieldObjectHelper *)(local_88 + 0x20)), iVar2 != from_default_q)
       ) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/Q","");
      QPDFObjectHandle::newInteger(&local_e8,(long)from_default_q);
      QPDFObjectHandle::replaceKey(obj,&local_d8,&local_e8);
      if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
              ((QPDFFormFieldObjectHelper *)(local_88 + 0x20));
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::adjustInheritedFields(
    QPDFObjectHandle obj,
    bool override_da,
    std::string const& from_default_da,
    bool override_q,
    int from_default_q)
{
    // Override /Q or /DA if needed. If this object has a field type, directly or inherited, it is a
    // field and not just an annotation. In that case, we need to override if we are getting a value
    // from the document that is different from the value we would have gotten from the old
    // document. We must take care not to override an explicit value. It's possible that /FT may be
    // inherited by lower fields that may explicitly set /DA or /Q or that this is a field whose
    // type does not require /DA or /Q and we may be put a value on the field that is unused. This
    // is harmless, so it's not worth trying to work around.

    auto has_explicit = [](QPDFFormFieldObjectHelper& field, std::string const& key) {
        if (field.getObjectHandle().hasKey(key)) {
            return true;
        }
        auto oh = field.getInheritableFieldValue(key);
        if (!oh.isNull()) {
            return true;
        }
        return false;
    };

    if (override_da || override_q) {
        QPDFFormFieldObjectHelper cur_field(obj);
        if (override_da && (!has_explicit(cur_field, "/DA"))) {
            std::string da = cur_field.getDefaultAppearance();
            if (da != from_default_da) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper override da");
                obj.replaceKey("/DA", QPDFObjectHandle::newUnicodeString(from_default_da));
            }
        }
        if (override_q && (!has_explicit(cur_field, "/Q"))) {
            int q = cur_field.getQuadding();
            if (q != from_default_q) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper override q");
                obj.replaceKey("/Q", QPDFObjectHandle::newInteger(from_default_q));
            }
        }
    }
}